

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool gl4cts::ShaderSubroutine::Utils::buildProgram
               (Functions *gl,string *vs_body,string *tc_body,string *te_body,string *gs_body,
               string *fs_body,GLchar **xfb_varyings,uint *n_xfb_varyings,GLuint *out_vs_id,
               GLuint *out_tc_id,GLuint *out_te_id,GLuint *out_gs_id,GLuint *out_fs_id,
               GLuint *out_po_id)

{
  GLuint GVar1;
  deUint32 dVar2;
  GLuint local_dc;
  GLuint local_cc;
  GLuint local_bc;
  GLuint local_ac;
  GLuint local_9c;
  int local_98;
  uint local_94;
  GLint compile_status;
  GLuint so_id;
  uint n_so_id;
  uint n_so_ids;
  GLuint so_ids [5];
  undefined8 local_68;
  char *fs_body_raw_ptr;
  char *gs_body_raw_ptr;
  char *te_body_raw_ptr;
  char *tc_body_raw_ptr;
  char *vs_body_raw_ptr;
  GLint link_status;
  bool result;
  string *fs_body_local;
  string *gs_body_local;
  string *te_body_local;
  string *tc_body_local;
  string *vs_body_local;
  Functions *gl_local;
  
  vs_body_raw_ptr._7_1_ = 0;
  vs_body_raw_ptr._0_4_ = 0;
  _link_status = fs_body;
  fs_body_local = gs_body;
  gs_body_local = te_body;
  te_body_local = tc_body;
  tc_body_local = vs_body;
  vs_body_local = (string *)gl;
  GVar1 = (*gl->createProgram)();
  *out_po_id = GVar1;
  dVar2 = (**(code **)(vs_body_local + 0x40))();
  glu::checkError(dVar2,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x34c);
  if (out_vs_id != (GLuint *)0x0) {
    tc_body_raw_ptr = (char *)std::__cxx11::string::c_str();
    GVar1 = (*(code *)vs_body_local[0x1f].field_2._M_allocated_capacity)(0x8b31);
    *out_vs_id = GVar1;
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x353);
    (*(code *)(vs_body_local->field_2)._M_allocated_capacity)(*out_po_id,*out_vs_id);
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x356);
    (**(code **)((long)&vs_body_local[0x95].field_2 + 8))(*out_vs_id,1,&tc_body_raw_ptr,0);
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x359);
  }
  if (out_tc_id != (GLuint *)0x0) {
    te_body_raw_ptr = (char *)std::__cxx11::string::c_str();
    GVar1 = (*(code *)vs_body_local[0x1f].field_2._M_allocated_capacity)(0x8e88);
    *out_tc_id = GVar1;
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x361);
    (*(code *)(vs_body_local->field_2)._M_allocated_capacity)(*out_po_id,*out_tc_id);
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x364);
    (**(code **)((long)&vs_body_local[0x95].field_2 + 8))(*out_tc_id,1,&te_body_raw_ptr,0);
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x367);
  }
  if (out_te_id != (GLuint *)0x0) {
    gs_body_raw_ptr = (char *)std::__cxx11::string::c_str();
    GVar1 = (*(code *)vs_body_local[0x1f].field_2._M_allocated_capacity)(0x8e87);
    *out_te_id = GVar1;
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x36f);
    (*(code *)(vs_body_local->field_2)._M_allocated_capacity)(*out_po_id,*out_te_id);
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x372);
    (**(code **)((long)&vs_body_local[0x95].field_2 + 8))(*out_te_id,1,&gs_body_raw_ptr,0);
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x375);
  }
  if (out_gs_id != (GLuint *)0x0) {
    fs_body_raw_ptr = (char *)std::__cxx11::string::c_str();
    GVar1 = (*(code *)vs_body_local[0x1f].field_2._M_allocated_capacity)(0x8dd9);
    *out_gs_id = GVar1;
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x37d);
    (*(code *)(vs_body_local->field_2)._M_allocated_capacity)(*out_po_id,*out_gs_id);
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x380);
    (**(code **)((long)&vs_body_local[0x95].field_2 + 8))(*out_gs_id,1,&fs_body_raw_ptr,0);
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,899);
  }
  if (out_fs_id != (GLuint *)0x0) {
    local_68 = std::__cxx11::string::c_str();
    GVar1 = (*(code *)vs_body_local[0x1f].field_2._M_allocated_capacity)(0x8b30);
    *out_fs_id = GVar1;
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x38b);
    (*(code *)(vs_body_local->field_2)._M_allocated_capacity)(*out_po_id,*out_fs_id);
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x38e);
    (**(code **)((long)&vs_body_local[0x95].field_2 + 8))(*out_fs_id,1,&local_68,0);
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x391);
  }
  if (out_vs_id == (GLuint *)0x0) {
    local_9c = 0;
  }
  else {
    local_9c = *out_vs_id;
  }
  n_so_id = local_9c;
  if (out_tc_id == (GLuint *)0x0) {
    local_ac = 0;
  }
  else {
    local_ac = *out_tc_id;
  }
  n_so_ids = local_ac;
  if (out_te_id == (GLuint *)0x0) {
    local_bc = 0;
  }
  else {
    local_bc = *out_te_id;
  }
  so_ids[0] = local_bc;
  if (out_gs_id == (GLuint *)0x0) {
    local_cc = 0;
  }
  else {
    local_cc = *out_gs_id;
  }
  so_ids[1] = local_cc;
  if (out_fs_id == (GLuint *)0x0) {
    local_dc = 0;
  }
  else {
    local_dc = *out_fs_id;
  }
  so_ids[2] = local_dc;
  so_id = 5;
  for (compile_status = 0; (uint)compile_status < 5; compile_status = compile_status + 1) {
    local_94 = (&n_so_id)[(uint)compile_status];
    if (local_94 != 0) {
      local_98 = 0;
      (*(code *)vs_body_local[0x12]._M_string_length)(local_94);
      dVar2 = (**(code **)(vs_body_local + 0x40))();
      glu::checkError(dVar2,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x3a3);
      (*(code *)vs_body_local[0x53].field_2._M_allocated_capacity)(local_94,0x8b81,&local_98);
      dVar2 = (**(code **)(vs_body_local + 0x40))();
      glu::checkError(dVar2,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x3a6);
      if (local_98 != 1) goto LAB_010123b3;
    }
  }
  if (xfb_varyings != (GLchar **)0x0) {
    (*(code *)vs_body_local[0xa6]._M_string_length)(*out_po_id,*n_xfb_varyings,xfb_varyings,0x8c8c);
    dVar2 = (**(code **)(vs_body_local + 0x40))();
    glu::checkError(dVar2,"glTransformFeedbackVaryings() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x3b3);
  }
  (*(code *)vs_body_local[0x67]._M_string_length)(*out_po_id);
  dVar2 = (**(code **)(vs_body_local + 0x40))();
  glu::checkError(dVar2,"glLinkProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x3b7);
  (**(code **)((long)&vs_body_local[0x4e].field_2 + 8))(*out_po_id,0x8b82,&vs_body_raw_ptr);
  dVar2 = (**(code **)(vs_body_local + 0x40))();
  glu::checkError(dVar2,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x3ba);
  if ((int)vs_body_raw_ptr == 1) {
    vs_body_raw_ptr._7_1_ = 1;
  }
LAB_010123b3:
  return (bool)(vs_body_raw_ptr._7_1_ & 1);
}

Assistant:

bool Utils::buildProgram(const glw::Functions& gl, const std::string& vs_body, const std::string& tc_body,
						 const std::string& te_body, const std::string& gs_body, const std::string& fs_body,
						 const glw::GLchar** xfb_varyings, const unsigned int& n_xfb_varyings, glw::GLuint* out_vs_id,
						 glw::GLuint* out_tc_id, glw::GLuint* out_te_id, glw::GLuint* out_gs_id, glw::GLuint* out_fs_id,
						 glw::GLuint* out_po_id)
{
	bool result = false;

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	/* Create objects, set up shader bodies and attach all requested shaders to the program object */
	*out_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	if (out_vs_id != DE_NULL)
	{
		const char* vs_body_raw_ptr = vs_body.c_str();

		*out_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

		gl.attachShader(*out_po_id, *out_vs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

		gl.shaderSource(*out_vs_id, 1 /* count */, &vs_body_raw_ptr, DE_NULL /* length */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");
	}

	if (out_tc_id != DE_NULL)
	{
		const char* tc_body_raw_ptr = tc_body.c_str();

		*out_tc_id = gl.createShader(GL_TESS_CONTROL_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

		gl.attachShader(*out_po_id, *out_tc_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

		gl.shaderSource(*out_tc_id, 1 /* count */, &tc_body_raw_ptr, DE_NULL /* length */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");
	}

	if (out_te_id != DE_NULL)
	{
		const char* te_body_raw_ptr = te_body.c_str();

		*out_te_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

		gl.attachShader(*out_po_id, *out_te_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

		gl.shaderSource(*out_te_id, 1 /* count */, &te_body_raw_ptr, DE_NULL /* length */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");
	}

	if (out_gs_id != DE_NULL)
	{
		const char* gs_body_raw_ptr = gs_body.c_str();

		*out_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

		gl.attachShader(*out_po_id, *out_gs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

		gl.shaderSource(*out_gs_id, 1 /* count */, &gs_body_raw_ptr, DE_NULL /* length */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");
	}

	if (out_fs_id != DE_NULL)
	{
		const char* fs_body_raw_ptr = fs_body.c_str();

		*out_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

		gl.attachShader(*out_po_id, *out_fs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

		gl.shaderSource(*out_fs_id, 1 /* count */, &fs_body_raw_ptr, DE_NULL /* length */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");
	}

	/* Compile all shaders */
	const glw::GLuint so_ids[] = { (out_vs_id != DE_NULL) ? *out_vs_id : 0, (out_tc_id != DE_NULL) ? *out_tc_id : 0,
								   (out_te_id != DE_NULL) ? *out_te_id : 0, (out_gs_id != DE_NULL) ? *out_gs_id : 0,
								   (out_fs_id != DE_NULL) ? *out_fs_id : 0 };
	const unsigned int n_so_ids = sizeof(so_ids) / sizeof(so_ids[0]);

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		glw::GLuint so_id = so_ids[n_so_id];

		if (so_id != 0)
		{
			glw::GLint compile_status = GL_FALSE;

			gl.compileShader(so_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

			gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

			if (compile_status != GL_TRUE)
			{
				goto end;
			}
		} /* if (so_id != 0) */
	}	 /* for (all shader objects) */

	/* Set up XFB */
	if (xfb_varyings != NULL)
	{
		gl.transformFeedbackVaryings(*out_po_id, n_xfb_varyings, xfb_varyings, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");
	}

	gl.linkProgram(*out_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(*out_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		goto end;
	}

	/* All done */
	result = true;

end:
	return result;
}